

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkService.cpp
# Opt level: O3

void __thiscall NetworkService::poll_frontend(NetworkService *this)

{
  _Elt_pointer pbVar1;
  pointer pcVar2;
  WorkerContext *pWVar3;
  mapped_type *pmVar4;
  socket_t *psVar5;
  string_view trace;
  string_view trace_00;
  string_view trace_01;
  string_view trace_02;
  string_view trace_03;
  string_view trace_04;
  string_view trace_05;
  string_view trace_06;
  string worker_addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> client_addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> request;
  Task task;
  DatabaseSnapshot snapshot;
  undefined1 local_2e8 [32];
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  local_268;
  undefined1 local_248 [184];
  undefined1 local_190 [192];
  pointer local_d0;
  pointer local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_58;
  
  psVar5 = &this->frontend;
  trace._M_str = 
  "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,144)"
  ;
  trace._M_len = 0x68;
  s_recv<std::__cxx11::string>(&local_2a8,psVar5,trace);
  trace_04._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,146)"
  ;
  trace_04._M_len = 0x68;
  s_recv_padding(psVar5,trace_04);
  trace_00._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,148)"
  ;
  trace_00._M_len = 0x68;
  s_recv<std::__cxx11::string>(&local_288,psVar5,trace_00);
  local_268.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Database::snapshot((DatabaseSnapshot *)local_190,this->db);
  parse_command((Command *)local_248,&local_288);
  dispatch_locks(&local_2c8,(Command *)local_248,(DatabaseSnapshot *)local_190);
  local_2e8._16_8_ =
       local_268.
       super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2e8._8_8_ =
       local_268.
       super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2e8._0_8_ =
       local_268.
       super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_268.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_2c8.
       super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_268.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_2c8.
       super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_268.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_2c8.
       super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2c8.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::~vector((vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
             *)local_2e8);
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::~vector(&local_2c8);
  std::__detail::__variant::
  _Variant_storage<false,_SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
  ::~_Variant_storage((_Variant_storage<false,_SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
                       *)local_248);
  local_248._0_8_ = Database::allocate_task(this->db,&local_288,&local_2a8,&local_268);
  local_248._8_8_ = 0;
  local_248._16_8_ = 0;
  local_248._24_8_ = 0;
  pbVar1 = (this->worker_queue).c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  local_2e8._0_8_ = (pointer)(local_2e8 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2e8,pcVar2,pcVar2 + pbVar1->_M_string_length);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_front(&(this->worker_queue).c);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<WorkerContext,_std::default_delete<WorkerContext>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<WorkerContext,_std::default_delete<WorkerContext>_>_>_>_>
           ::at(&this->wctxs,(key_type *)local_2e8);
  pWVar3 = (pmVar4->_M_t).super___uniq_ptr_impl<WorkerContext,_std::default_delete<WorkerContext>_>.
           _M_t.super__Tuple_impl<0UL,_WorkerContext_*,_std::default_delete<WorkerContext>_>.
           super__Head_base<0UL,_WorkerContext_*,_false>._M_head_impl;
  std::optional<Task>::operator=(&pWVar3->task,(Task *)local_248);
  DatabaseSnapshot::operator=(&pWVar3->snap,(DatabaseSnapshot *)local_190);
  psVar5 = &this->backend;
  trace_01._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,184)"
  ;
  trace_01._M_len = 0x68;
  s_send<std::__cxx11::string>
            (psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
             trace_01,2);
  trace_05._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,185)"
  ;
  trace_05._M_len = 0x68;
  s_send_padding(psVar5,trace_05,2);
  trace_02._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,186)"
  ;
  trace_02._M_len = 0x68;
  s_send<std::__cxx11::string>(psVar5,&local_2a8,trace_02,2);
  trace_06._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,187)"
  ;
  trace_06._M_len = 0x68;
  s_send_padding(psVar5,trace_06,2);
  trace_03._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,188)"
  ;
  trace_03._M_len = 0x68;
  s_send<std::__cxx11::string>(psVar5,&local_288,trace_03,0);
  if ((pointer)local_2e8._0_8_ != (pointer)(local_2e8 + 0x10)) {
    operator_delete((void *)local_2e8._0_8_,(ulong)(local_2e8._16_8_ + 1));
  }
  std::vector<DBChange,_std::allocator<DBChange>_>::~vector
            ((vector<DBChange,_std::allocator<DBChange>_> *)(local_248 + 8));
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_b8);
  if (local_d0 != (pointer)0x0) {
    operator_delete(local_d0,(long)local_c0 - (long)local_d0);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_190 + 0xb8),local_190[0xb0]);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
               *)(local_190 + 0x80));
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)(local_190 + 0x40));
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_190);
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::~vector(&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void NetworkService::poll_frontend() {
    //  Now get next client request, route to LRU worker
    //  Client request is [address][empty][request]
    auto client_addr{s_recv<std::string>(&frontend, ZMQTRACE)};

    s_recv_padding(&frontend, ZMQTRACE);

    auto request{s_recv<std::string>(&frontend, ZMQTRACE)};

    std::vector<DatabaseLock> locks;
    DatabaseSnapshot snapshot = db.snapshot();

    try {
        Command cmd{parse_command(request)};
        locks = std::move(dispatch_locks(cmd, &snapshot));
    } catch (const std::runtime_error &err) {
        s_send(&frontend, client_addr, ZMQTRACE, ZMQ_SNDMORE);
        s_send_padding(&frontend, ZMQTRACE, ZMQ_SNDMORE);
        s_send(&frontend, Response::error("Parse error").to_string(), ZMQTRACE);
        return;
    }

    TaskSpec *spec = nullptr;
    try {
        spec = db.allocate_task(request, client_addr, locks);
    } catch (const std::runtime_error &err) {
        s_send(&frontend, client_addr, ZMQTRACE, ZMQ_SNDMORE);
        s_send_padding(&frontend, ZMQTRACE, ZMQ_SNDMORE);
        s_send(&frontend,
               Response::error("Can't acquire lock, try again later", true)
                   .to_string(),
               ZMQTRACE);
        return;
    }

    Task task{Task(spec)};

    std::string worker_addr = worker_queue.front();
    worker_queue.pop();
    WorkerContext *wctx = wctxs.at(worker_addr).get();
    wctx->task = std::move(task);
    wctx->snap = std::move(snapshot);

    s_send(&backend, worker_addr, ZMQTRACE, ZMQ_SNDMORE);
    s_send_padding(&backend, ZMQTRACE, ZMQ_SNDMORE);
    s_send(&backend, client_addr, ZMQTRACE, ZMQ_SNDMORE);
    s_send_padding(&backend, ZMQTRACE, ZMQ_SNDMORE);
    s_send(&backend, request, ZMQTRACE);
}